

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<CPubKey,_std::allocator<CPubKey>_> * Vector<CPubKey>(CPubKey *args)

{
  long lVar1;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  vector<CPubKey,_std::allocator<CPubKey>_> *ret;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_ffffffffffffff98;
  CPubKey *__args;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  __args = in_RDI;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector(in_stack_ffffffffffffff98);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)CONCAT17(uVar2,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::emplace_back<CPubKey>
            (in_stack_ffffffffffffffb8,__args);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<CPubKey,_std::allocator<CPubKey>_> *)in_RDI;
}

Assistant:

inline std::vector<typename std::common_type<Args...>::type> Vector(Args&&... args)
{
    std::vector<typename std::common_type<Args...>::type> ret;
    ret.reserve(sizeof...(args));
    // The line below uses the trick from https://www.experts-exchange.com/articles/32502/None-recursive-variadic-templates-with-std-initializer-list.html
    (void)std::initializer_list<int>{(ret.emplace_back(std::forward<Args>(args)), 0)...};
    return ret;
}